

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

FileRecord * __thiscall
diy::FileStorage::extract_file_record(FileRecord *__return_storage_ptr__,FileStorage *this,int i)

{
  mapped_type *pmVar1;
  CriticalMapAccessor accessor;
  int local_34;
  _Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  *local_30;
  unique_lock<tthread::fast_mutex> local_28;
  
  local_34 = i;
  critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::access((critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
            *)&local_30,(char *)&this->filenames_,i);
  pmVar1 = std::
           map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
           ::operator[]((map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
                         *)local_30,&local_34);
  FileRecord::FileRecord(__return_storage_ptr__,pmVar1);
  std::
  _Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  ::erase(local_30,&local_34);
  std::unique_lock<tthread::fast_mutex>::~unique_lock(&local_28);
  return __return_storage_ptr__;
}

Assistant:

FileRecord    extract_file_record(int i)
      {
        CriticalMapAccessor accessor = filenames_.access();
        FileRecord fr = (*accessor)[i];
        accessor->erase(i);
        return fr;
      }